

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O2

DdNode * cuddSubsetShortPaths(DdManager *dd,DdNode *f,int numVars,int threshold,int hardlimit)

{
  FILE *__s;
  NodeDist_t **ppNVar1;
  int iVar2;
  int iVar3;
  AssortedInfo *pathLengthArray;
  long lVar4;
  FILE *pFVar5;
  DdNode **__ptr;
  DdNode *value;
  DdNode ***pppDVar6;
  AssortedInfo *info;
  st__table *psVar7;
  int *piVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  int in_R9D;
  FILE *fp;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  NodeDist_t ***pppNVar16;
  NodeDist_t *nodeStat;
  
  one = dd->one;
  zero = (DdNode *)((ulong)one ^ 1);
  if (numVars == 0) {
    numVars = Cudd_ReadSize(dd);
  }
  iVar3 = 0;
  if (numVars < threshold) {
    iVar3 = numVars;
  }
  if (f == (DdNode *)0x0) {
    fwrite("Cannot partition, nil object\n",0x1d,1,(FILE *)dd->err);
    dd->errorCode = CUDD_INVALID_ARG;
    return (DdNode *)0x0;
  }
  piVar8 = (int *)((ulong)f & 0xfffffffffffffffe);
  if (*piVar8 == 0x7fffffff) {
    return f;
  }
  pathLengthArray = (AssortedInfo *)malloc((long)numVars * 4 + 4);
  for (lVar4 = 0; lVar4 <= numVars; lVar4 = lVar4 + 1) {
    (&pathLengthArray->maxpath)[lVar4] = 0;
  }
  __s = (FILE *)dd->err;
  pFVar5 = (FILE *)st__init_table(st__ptrcmp,st__ptrhash);
  maxNodeDistPages = 0x80;
  __ptr = (DdNode **)malloc(0x400);
  nodeDistPages = (NodeDist_t **)__ptr;
  if (__ptr != (DdNode **)0x0) {
    nodeDistPage = 0;
    value = (DdNode *)malloc(0x10000);
    *__ptr = value;
    currentNodeDistPage = (NodeDist_t *)value;
    if (value == (DdNode *)0x0) {
      bVar12 = true;
      lVar4 = 0;
      while (lVar15 = lVar4, bVar12) {
        bVar12 = false;
        lVar4 = 1;
        if (__ptr[lVar15] != (DdNode *)0x0) {
          free(__ptr[lVar15]);
          __ptr[lVar15] = (DdNode *)0x0;
          bVar12 = false;
        }
      }
      free(__ptr);
      nodeDistPages = (NodeDist_t **)0x0;
    }
    else {
      nodeDistPageIndex = 0;
      maxQueuePages = 0x80;
      pppDVar6 = (DdNode ***)malloc(0x400);
      queuePages = pppDVar6;
      if (pppDVar6 != (DdNode ***)0x0) {
        queuePage = 0;
        currentQueuePage = (DdNode **)malloc(0x4000);
        *pppDVar6 = currentQueuePage;
        if (currentQueuePage == (DdNode **)0x0) {
          bVar12 = true;
          lVar4 = 0;
          while (lVar15 = lVar4, bVar12) {
            bVar12 = false;
            lVar4 = 1;
            if (pppDVar6[lVar15] != (DdNode **)0x0) {
              free(pppDVar6[lVar15]);
              pppDVar6[lVar15] = (DdNode **)0x0;
              bVar12 = false;
            }
          }
          free(pppDVar6);
          queuePages = (DdNode ***)0x0;
        }
        else {
          *currentQueuePage = f;
          queuePageIndex = 1;
          if (memOut == 1) {
            bVar12 = true;
            lVar4 = 0;
            while (lVar15 = lVar4, bVar12) {
              bVar12 = false;
              lVar4 = 1;
              if (__ptr[lVar15] != (DdNode *)0x0) {
                free(__ptr[lVar15]);
                __ptr[lVar15] = (DdNode *)0x0;
                bVar12 = false;
              }
            }
            bVar12 = true;
            pppNVar16 = &nodeDistPages;
            lVar4 = 0;
            fp = pFVar5;
            do {
              free(__ptr);
              *pppNVar16 = (NodeDist_t **)0x0;
              do {
                lVar15 = lVar4;
                if (!bVar12) goto LAB_00667aa0;
                __ptr = pppDVar6[lVar15];
                bVar12 = false;
                lVar4 = 1;
              } while (__ptr == (DdNode **)0x0);
              pppNVar16 = (NodeDist_t ***)(pppDVar6 + lVar15);
              bVar12 = false;
            } while( true );
          }
          nodeDistPageIndex = 1;
          value->index = 0xffffffff;
          value->ref = 0xffffffff;
          *(DdHalfWord *)&value->next = 0xffffffff;
          *(DdHalfWord *)((long)&value->next + 4) = 0xffffffff;
          value->type = (anon_union_16_2_50f58667_for_type)0x0;
          fp = pFVar5;
          iVar2 = st__insert((st__table *)pFVar5,(char *)piVar8,(char *)value);
          ppNVar1 = nodeDistPages;
          if (iVar2 == 1) {
            fwrite("Something wrong, the entry exists but didnt show up in st__lookup\n",0x42,1,__s)
            ;
            goto LAB_00667adb;
          }
          if (iVar2 == -10000) {
            memOut = 1;
            iVar3 = nodeDistPage;
            if (nodeDistPage < 0) {
              iVar3 = -1;
            }
            for (lVar4 = 0; (long)iVar3 + 1 != lVar4; lVar4 = lVar4 + 1) {
              if (ppNVar1[lVar4] != (NodeDist_t *)0x0) {
                free(ppNVar1[lVar4]);
                ppNVar1[lVar4] = (NodeDist_t *)0x0;
              }
            }
            if (ppNVar1 != (NodeDist_t **)0x0) {
              free(ppNVar1);
              nodeDistPages = (NodeDist_t **)0x0;
            }
            pppDVar6 = queuePages;
            iVar3 = -1;
            if (-1 < queuePage) {
              iVar3 = queuePage;
            }
            for (lVar4 = 0; (long)iVar3 + 1 != lVar4; lVar4 = lVar4 + 1) {
              if (pppDVar6[lVar4] != (DdNode **)0x0) {
                free(pppDVar6[lVar4]);
                pppDVar6[lVar4] = (DdNode **)0x0;
              }
            }
            if (pppDVar6 != (DdNode ***)0x0) {
LAB_00667aa0:
              free(pppDVar6);
              queuePages = (DdNode ***)0x0;
            }
            st__free_table((st__table *)fp);
          }
          else {
            if (((ulong)f & 1) == 0) {
              value->ref = 0;
            }
            else {
              value->index = 0;
            }
            CreateTopDist((st__table *)pFVar5,0,0,0,(DdNode **)0x1,in_R9D,(int)piVar8,fp);
            if (memOut != 1) {
              iVar2 = CreateBotDist(f,(st__table *)pFVar5,(uint *)pathLengthArray,(FILE *)__s);
              pppDVar6 = queuePages;
              if (iVar2 != 0) {
                iVar2 = queuePage;
                if (queuePage < 0) {
                  iVar2 = -1;
                }
                for (lVar4 = 0; (long)iVar2 + 1 != lVar4; lVar4 = lVar4 + 1) {
                  if (pppDVar6[lVar4] != (DdNode **)0x0) {
                    free(pppDVar6[lVar4]);
                    pppDVar6[lVar4] = (DdNode **)0x0;
                  }
                }
                if (pppDVar6 != (DdNode ***)0x0) {
                  free(pppDVar6);
                  queuePages = (DdNode ***)0x0;
                }
                if ((fp != (FILE *)0x0) && ((memOut & 1) == 0)) {
                  uVar11 = 0;
                  uVar14 = 0;
                  iVar2 = threshold - iVar3;
                  while ((uVar13 = (uint)uVar14, uVar11 < numVars + 1U && (0 < iVar2))) {
                    iVar2 = iVar2 - (&pathLengthArray->maxpath)[uVar11];
                    if ((&pathLengthArray->maxpath)[uVar11] != 0) {
                      uVar14 = uVar11 & 0xffffffff;
                    }
                    uVar11 = uVar11 + 1;
                  }
                  if (iVar2 < 0) {
                    iVar2 = iVar2 + (&pathLengthArray->maxpath)[uVar14];
                  }
                  else {
                    uVar13 = uVar13 + 1;
                    iVar2 = 0;
                  }
                  pFVar5 = fp;
                  if (uVar13 == 0) {
                    fwrite("Path Length array seems to be all zeroes, check\n",0x30,1,
                           (FILE *)dd->err);
                  }
                  if (uVar13 == numVars + 1U) {
                    piVar8[1] = piVar8[1] + 1;
                  }
                  else {
                    info = (AssortedInfo *)malloc(0x20);
                    info->maxpath = uVar13;
                    info->findShortestPath = 0;
                    info->thresholdReached = iVar2;
                    psVar7 = st__init_table(st__ptrcmp,st__ptrhash);
                    info->maxpathTable = psVar7;
                    info->threshold = threshold - iVar3;
                    iVar3 = st__lookup((st__table *)fp,(char *)piVar8,(char **)&nodeStat);
                    if (iVar3 == 0) {
                      fwrite("Something wrong, root node must be in table\n",0x2c,1,(FILE *)dd->err)
                      ;
                      dd->errorCode = CUDD_INTERNAL_ERROR;
                      pathLengthArray = info;
                      goto LAB_00667adb;
                    }
                    uVar10 = 0xffffffff;
                    uVar9 = uVar10;
                    if ((nodeStat->oddTopDist != 0xffffffff) &&
                       (uVar9 = nodeStat->oddTopDist + nodeStat->oddBotDist,
                       nodeStat->oddBotDist == 0xffffffff)) {
                      uVar9 = 0xffffffff;
                    }
                    if ((nodeStat->evenTopDist != 0xffffffff) &&
                       (uVar10 = nodeStat->evenTopDist + nodeStat->evenBotDist,
                       nodeStat->evenBotDist == 0xffffffff)) {
                      uVar10 = 0xffffffff;
                    }
                    if (uVar9 < uVar10) {
                      uVar10 = uVar9;
                    }
                    if (uVar13 < uVar10) {
                      fprintf((FILE *)dd->err,
                              "All computations are bogus, since root has path length greater than max path length within threshold %u, %u\n"
                              ,(ulong)uVar13);
                      dd->errorCode = CUDD_INTERNAL_ERROR;
                      return (DdNode *)0x0;
                    }
                    if (hardlimit == 0) {
                      psVar7 = (st__table *)0x0;
                      fp = pFVar5;
                    }
                    else {
                      psVar7 = st__init_table(st__ptrcmp,st__ptrhash);
                      fp = pFVar5;
                    }
                    f = BuildSubsetBdd(dd,(st__table *)fp,f,info,psVar7);
                    if (f != (DdNode *)0x0) {
                      piVar8 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
                      *piVar8 = *piVar8 + 1;
                    }
                    if (psVar7 != (st__table *)0x0) {
                      st__free_table(psVar7);
                    }
                    st__free_table(info->maxpathTable);
                    st__foreach((st__table *)fp,stPathTableDdFree,(char *)dd);
                    free(info);
                  }
                  st__free_table((st__table *)fp);
                  free(pathLengthArray);
                  ppNVar1 = nodeDistPages;
                  lVar15 = (long)nodeDistPage;
                  for (lVar4 = 0; lVar4 <= lVar15; lVar4 = lVar4 + 1) {
                    if (ppNVar1[lVar4] != (NodeDist_t *)0x0) {
                      free(ppNVar1[lVar4]);
                      ppNVar1[lVar4] = (NodeDist_t *)0x0;
                    }
                  }
                  if (ppNVar1 != (NodeDist_t **)0x0) {
                    free(ppNVar1);
                    nodeDistPages = (NodeDist_t **)0x0;
                  }
                  if (f == (DdNode *)0x0) {
                    return (DdNode *)0x0;
                  }
                  piVar8 = (int *)(((ulong)f & 0xfffffffffffffffe) + 4);
                  *piVar8 = *piVar8 + -1;
                  return f;
                }
                if (fp != (FILE *)0x0) {
                  st__free_table((st__table *)fp);
                }
              }
              goto LAB_00667adb;
            }
            fwrite("Out of Memory and cant count path lengths\n",0x2a,1,__s);
          }
        }
      }
    }
  }
  fwrite("Out of Memory, cannot allocate pages\n",0x25,1,__s);
  memOut = 1;
LAB_00667adb:
  free(pathLengthArray);
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddSubsetShortPaths(
  DdManager * dd /* DD manager */,
  DdNode * f /* function to be subset */,
  int  numVars /* total number of variables in consideration */,
  int  threshold /* maximum number of nodes allowed in the subset */,
  int  hardlimit /* flag determining whether thershold should be respected strictly */)
{
    st__table *pathTable;
    DdNode *N, *subset;

    unsigned int  *pathLengthArray;
    unsigned int maxpath, oddLen, evenLen, pathLength, *excess;
    int i;
    NodeDist_t  *nodeStat;
    struct AssortedInfo *info;
    st__table *subsetNodeTable;

    one = DD_ONE(dd);
    zero = Cudd_Not(one);

    if (numVars == 0) {
      /* set default value */
      numVars = Cudd_ReadSize(dd);
    }

    if (threshold > numVars) {
        threshold = threshold - numVars;
    }
    if (f == NULL) {
        fprintf(dd->err, "Cannot partition, nil object\n");
        dd->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }
    if (Cudd_IsConstant(f))
        return (f);

    pathLengthArray = ABC_ALLOC(unsigned int, numVars+1);
    for (i = 0; i < numVars+1; i++) pathLengthArray[i] = 0;


#ifdef DD_DEBUG
    numCalls = 0;
#endif

    pathTable = CreatePathTable(f, pathLengthArray, dd->err);

    if ((pathTable == NULL) || (memOut)) {
        if (pathTable != NULL)
            st__free_table(pathTable);
        ABC_FREE(pathLengthArray);
        return (NIL(DdNode));
    }

    excess = ABC_ALLOC(unsigned int, 1);
    *excess = 0;
    maxpath = AssessPathLength(pathLengthArray, threshold, numVars, excess,
                               dd->err);

    if (maxpath != (unsigned) (numVars + 1)) {

        info = ABC_ALLOC(struct AssortedInfo, 1);
        info->maxpath = maxpath;
        info->findShortestPath = 0;
        info->thresholdReached = *excess;
        info->maxpathTable = st__init_table( st__ptrcmp, st__ptrhash);
        info->threshold = threshold;

#ifdef DD_DEBUG
        (void) fprintf(dd->out, "Path length array\n");
        for (i = 0; i < (numVars+1); i++) {
            if (pathLengthArray[i])
                (void) fprintf(dd->out, "%d ",i);
        }
        (void) fprintf(dd->out, "\n");
        for (i = 0; i < (numVars+1); i++) {
            if (pathLengthArray[i])
                (void) fprintf(dd->out, "%d ",pathLengthArray[i]);
        }
        (void) fprintf(dd->out, "\n");
        (void) fprintf(dd->out, "Maxpath  = %d, Thresholdreached = %d\n",
                       maxpath, info->thresholdReached);
#endif

        N = Cudd_Regular(f);
        if (! st__lookup(pathTable, (const char *)N, (char **)&nodeStat)) {
            fprintf(dd->err, "Something wrong, root node must be in table\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            ABC_FREE(excess);
            ABC_FREE(info);
            return(NULL);
        } else {
            if ((nodeStat->oddTopDist != MAXSHORTINT) &&
                (nodeStat->oddBotDist != MAXSHORTINT))
                oddLen = (nodeStat->oddTopDist + nodeStat->oddBotDist);
            else
                oddLen = MAXSHORTINT;

            if ((nodeStat->evenTopDist != MAXSHORTINT) &&
                (nodeStat->evenBotDist != MAXSHORTINT))
                evenLen = (nodeStat->evenTopDist +nodeStat->evenBotDist);
            else
                evenLen = MAXSHORTINT;

            pathLength = (oddLen <= evenLen) ? oddLen : evenLen;
            if (pathLength > maxpath) {
                (void) fprintf(dd->err, "All computations are bogus, since root has path length greater than max path length within threshold %u, %u\n", maxpath, pathLength);
                dd->errorCode = CUDD_INTERNAL_ERROR;
                return(NULL);
            }
        }

#ifdef DD_DEBUG
        numCalls = 0;
        hits = 0;
        thishit = 0;
#endif
        /* initialize a table to store computed nodes */
        if (hardlimit) {
            subsetNodeTable = st__init_table( st__ptrcmp, st__ptrhash);
        } else {
            subsetNodeTable = NIL( st__table);
        }
        subset = BuildSubsetBdd(dd, pathTable, f, info, subsetNodeTable);
        if (subset != NULL) {
            cuddRef(subset);
        }
        /* record the number of times a computed result for a node is hit */

#ifdef DD_DEBUG
        (void) fprintf(dd->out, "Hits = %d, New==Node = %d, NumCalls = %d\n",
                hits, thishit, numCalls);
#endif

        if (subsetNodeTable != NIL( st__table)) {
            st__free_table(subsetNodeTable);
        }
        st__free_table(info->maxpathTable);
        st__foreach(pathTable, stPathTableDdFree, (char *)dd);

        ABC_FREE(info);

    } else {/* if threshold larger than size of dd */
        subset = f;
        cuddRef(subset);
    }
    ABC_FREE(excess);
    st__free_table(pathTable);
    ABC_FREE(pathLengthArray);
    for (i = 0; i <= nodeDistPage; i++) ABC_FREE(nodeDistPages[i]);
    ABC_FREE(nodeDistPages);

#ifdef DD_DEBUG
    /* check containment of subset in f */
    if (subset != NULL) {
        DdNode *check;
        check = Cudd_bddIteConstant(dd, subset, f, one);
        if (check != one) {
            (void) fprintf(dd->err, "Wrong partition\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
        }
    }
#endif

    if (subset != NULL) {
        cuddDeref(subset);
        return(subset);
    } else {
        return(NULL);
    }

}